

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O2

void __thiscall
tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>::release_reference
          (make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *this)

{
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar1;
  underflow_error *this_00;
  
  pmVar1 = this[-1].super_state_t._zone._t;
  if (pmVar1 != (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0) {
    this[-1].super_state_t._zone._t =
         (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)
         ((long)&pmVar1[-1].super_zone_t._dim + 3);
    return;
  }
  this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
  std::underflow_error::underflow_error(this_00,"reference counter underflow");
  __cxa_throw(this_00,&std::underflow_error::typeinfo,std::underflow_error::~underflow_error);
}

Assistant:

inline void release_reference(void) const
  {
    refcount_t * refcount = refcount_addr();
    if (*refcount == 0)
      throw std::underflow_error("reference counter underflow");
    *refcount -= 1;
  }